

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O2

void deserialize_negative_container_count(void)

{
  size_t a;
  roaring_bitmap_t *prVar1;
  uint8_t data [8];
  
  data[0] = ':';
  data[1] = '0';
  data[2] = '\0';
  data[3] = '\0';
  data[4] = '\0';
  data[5] = '\0';
  data[6] = '\0';
  data[7] = 0x80;
  a = roaring_bitmap_portable_deserialize_size((char *)data,8);
  _assert_int_equal(a,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
                    ,0xb1);
  prVar1 = roaring_bitmap_portable_deserialize_safe((char *)data,8);
  _assert_true((ulong)(prVar1 == (roaring_bitmap_t *)0x0),"bitmap",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/robust_deserialization_unit.c"
               ,0xb4);
  return;
}

Assistant:

DEFINE_TEST(deserialize_negative_container_count) {
    // clang-format off
    const uint8_t data[] = {
        0x3A, 0x30, 0, 0,       // Serial Cookie No Run Container
        0x00, 0x00, 0x00, 0x80, // Container count (NEGATIVE)
    };
    // clang-format on
    assert_int_equal(roaring_bitmap_portable_deserialize_size((const char*)data,
                                                              sizeof(data)),
                     0);
    roaring_bitmap_t* bitmap = roaring_bitmap_portable_deserialize_safe(
        (const char*)data, sizeof(data));
    assert_null(bitmap);
}